

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

TypeID NULLCTypeInfo::TypeReturnType(int *typeID)

{
  uint *puVar1;
  uint uVar2;
  char *__function;
  uint uVar3;
  long lVar4;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0xdf,"TypeID NULLCTypeInfo::TypeReturnType(int *)");
  }
  if ((uint)*typeID < *(uint *)(linker + 0x20c)) {
    lVar4 = (ulong)(uint)*typeID * 0x50;
    puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar4);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar4) == 3) {
      if (*(int *)(linker + 0x21c) == 0) {
        __function = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00122606;
      }
      uVar3 = *(uint *)(*(long *)(linker + 0x210) + (ulong)puVar1[9] * 0xc);
    }
    else {
      uVar2 = *puVar1;
      if (*(uint *)(linker + 0x29c) <= uVar2) {
        __function = 
        "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00122606;
      }
      uVar3 = 0;
      nullcThrowError("typeid::returnType received type (%s) that is not a function",
                      (ulong)uVar2 + *(long *)(linker + 0x290));
    }
    return (TypeID)uVar3;
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00122606:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

TypeID TypeReturnType(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::returnType received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[type.memberOffset].type);
	}